

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

Var __thiscall
Js::CustomExternalWrapperObject::GetValueFromDescriptor
          (CustomExternalWrapperObject *this,Var instance,PropertyDescriptor *propertyDescriptor,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  Var aValue;
  RecyclableObject *function;
  undefined4 *puVar3;
  JavascriptLibrary *this_00;
  ScriptContext *requestContext_local;
  PropertyDescriptor *propertyDescriptor_local;
  Var instance_local;
  CustomExternalWrapperObject *this_local;
  
  bVar2 = PropertyDescriptor::ValueSpecified(propertyDescriptor);
  if (bVar2) {
    this_local = (CustomExternalWrapperObject *)PropertyDescriptor::GetValue(propertyDescriptor);
  }
  else {
    bVar2 = PropertyDescriptor::GetterSpecified(propertyDescriptor);
    if (bVar2) {
      aValue = PropertyDescriptor::GetGetter(propertyDescriptor);
      function = VarTo<Js::RecyclableObject>(aValue);
      this_local = (CustomExternalWrapperObject *)
                   Js::JavascriptOperators::CallGetter(function,instance,requestContext);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                  ,0x11b,"(0)","FALSE");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
      this_00 = ScriptContext::GetLibrary(requestContext);
      this_local = (CustomExternalWrapperObject *)
                   JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    }
  }
  return this_local;
}

Assistant:

Js::Var CustomExternalWrapperObject::GetValueFromDescriptor(Js::Var instance, Js::PropertyDescriptor propertyDescriptor, Js::ScriptContext * requestContext)
{
    if (propertyDescriptor.ValueSpecified())
    {
        return propertyDescriptor.GetValue();
    }
    if (propertyDescriptor.GetterSpecified())
    {
        return Js::JavascriptOperators::CallGetter(VarTo<RecyclableObject>(propertyDescriptor.GetGetter()), instance, requestContext);
    }
    Assert(FALSE);
    return requestContext->GetLibrary()->GetUndefined();
}